

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

int back_to_cmap(level *lev,xchar x,xchar y)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined7 in_register_00000011;
  int (*paiVar7) [5];
  int iVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  int (*paiVar11) [6];
  bool bVar12;
  ulong uStack_20;
  
  iVar8 = (int)CONCAT71(in_register_00000031,x);
  iVar6 = (int)CONCAT71(in_register_00000011,y);
  bVar1 = lev->locations[iVar8][iVar6].typ;
  if (0x26 < bVar1) {
    uVar9 = (uint)(char)bVar1;
    pcVar10 = "back_to_cmap:  unknown location type [ = %d ]";
LAB_001662ee:
    impossible(pcVar10,(ulong)uVar9);
    return 0xf;
  }
  switch(bVar1) {
  case 0:
  case 0x10:
    bVar3 = (lev->flags).field_0xa & 0x10;
    iVar6 = 0x1e;
LAB_001661d6:
    if (bVar3 == 0) {
      iVar6 = 1;
    }
    break;
  default:
    bVar3 = lev->locations[iVar8][iVar6].seenv;
    uVar9 = (uint)bVar3;
    if (bVar3 == 0) {
      return 1;
    }
    if (0xe < bVar1 - 1) {
switchD_001661c0_caseD_c:
      pcVar10 = "wall_angle: unexpected wall type %d";
      goto LAB_00166691;
    }
    uVar4 = (uint)bVar3;
    uVar5 = (uint)bVar3;
    switch((uint)bVar1) {
    case 1:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6;
      goto LAB_001663da;
    case 2:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6;
LAB_00166403:
      uVar9 = uVar9 >> 4 & 7;
      if (uVar9 == 0) {
        return 3;
      }
      if (uVar9 == 2) {
        bVar12 = (bVar3 & 0x8f) != 0;
LAB_00166667:
        return (uint)bVar12 * 2 + 1;
      }
      if (uVar9 == 1) {
        bVar12 = 7 < bVar3;
        goto LAB_00166667;
      }
      pcVar10 = "wall_angle: unknown hwall mode %d";
      goto LAB_00166691;
    case 3:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 4;
      }
      if (uVar9 == 2) {
        bVar3 = bVar3 & 0xef;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "tlcorn";
          goto LAB_00166754;
        }
        bVar3 = bVar3 & 0x38;
      }
      return (uint)(bVar3 != 0) * 3 + 1;
    case 4:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 5;
      }
      if (uVar9 == 2) {
        bVar12 = (bVar3 & 0xbf) != 0;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "trcorn";
          goto LAB_00166754;
        }
        bVar12 = 0x1f < bVar3;
      }
      return (uint)bVar12 * 4 + 1;
    case 5:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 6;
      }
      if (uVar9 == 2) {
        bVar3 = bVar3 & 0xfb;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "blcorn";
          goto LAB_00166754;
        }
        bVar3 = bVar3 & 0xe;
      }
      return (uint)(bVar3 != 0) * 5 + 1;
    case 6:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 7;
      }
      if (uVar9 == 2) {
        if (uVar4 == 1) {
          return 1;
        }
        return 7;
      }
      if (uVar9 != 1) {
        pcVar10 = "brcorn";
LAB_00166754:
        impossible("wall_angle: unknown %s mode %d",pcVar10);
        return 1;
      }
      bVar3 = bVar3 & 0x83;
      iVar6 = 7;
      goto LAB_001661d6;
    case 7:
      iVar2 = 1;
      switch(*(uint *)&lev->locations[iVar8][iVar6].field_0x6 >> 4 & 7) {
      case 0:
        if (uVar4 == 1) {
          return 7;
        }
        if (uVar4 == 0x40) {
          return 5;
        }
        if (uVar4 == 0x10) {
          return 4;
        }
        if (uVar4 == 4) {
          return 6;
        }
        if ((bVar3 < 8) && (uVar5 == 5 || (char)((uVar5 & 2) >> 1) != '\0')) {
          return 9;
        }
        if (((bVar3 & 0xe3) == 0) && (uVar5 == 0x14 || (char)((uVar5 & 8) >> 3) != '\0')) {
          return 0xc;
        }
        if (((bVar3 & 0x8f) == 0) && (uVar5 == 0x50 || (char)((uVar5 & 0x20) >> 5) != '\0')) {
          return 10;
        }
        if (((bVar3 & 0x3e) == 0) && (uVar4 == 0x41 || (char)bVar3 < '\0')) {
          return 0xb;
        }
        return 8;
      case 1:
        uVar9 = (bVar3 & 0xf) << 4 | (uint)(bVar3 >> 4);
        paiVar11 = (int (*) [6])0x28d768;
        break;
      case 2:
        uVar9 = (uint)(bVar3 >> 6) + (uVar5 & 0x3f) * 4;
        paiVar11 = (int (*) [6])0x28d780;
        break;
      case 3:
        uVar9 = (bVar3 & 3) << 6 | (uint)(bVar3 >> 2);
        paiVar11 = cross_matrix;
        break;
      case 4:
        paiVar11 = (int (*) [6])0x28d798;
        break;
      case 5:
        if ((bVar3 & 0xe) != 0 && (bVar3 & 0xf1) == 0) {
          return 6;
        }
        if (0x1f < bVar3 && (bVar3 & 0x1f) == 0) {
          return 5;
        }
        if ((bVar3 & 0xee) != 0) {
          iVar2 = 8;
        }
        bVar3 = bVar3 & 0x11;
        goto LAB_001668a9;
      case 6:
        if ((bVar3 & 0x83) != 0 && (bVar3 & 0x7c) == 0) {
          return 7;
        }
        if ((bVar3 & 0x38) != 0 && (bVar3 & 199) == 0) {
          return 4;
        }
        if ((bVar3 & 0xbb) != 0) {
          iVar2 = 8;
        }
        bVar3 = bVar3 & 0x44;
LAB_001668a9:
        if (bVar3 == 0) {
          return 8;
        }
        return iVar2;
      case 7:
        impossible("wall_angle: unknown crosswall mode");
        return 1;
      }
      if (uVar9 == 0x10) {
        return 1;
      }
      if ((uVar9 & 0xffffffef) == 1) {
        uStack_20 = 1;
        goto LAB_001668e1;
      }
      if ((uVar9 & 0xc) == 0) {
        if ((uVar9 & 0x60) == 0) {
          if ((uVar9 & 2) != 0) {
            uStack_20 = (ulong)(-1 < (char)uVar9) ^ 5;
            goto LAB_001668e1;
          }
          if ((char)uVar9 < '\0') {
            uStack_20 = 3;
            goto LAB_001668e1;
          }
          impossible("wall_angle: bottom of crwall check");
        }
        else if ((uVar9 & 2) == 0) {
          uStack_20 = (ulong)((uVar9 & 0x81) != 0) * 3;
          goto LAB_001668e1;
        }
      }
      else if ((uVar9 & 0xe0) == 0) {
        uStack_20 = (ulong)((uVar9 & 3) != 0) * 2 + 2;
        goto LAB_001668e1;
      }
      uStack_20 = 5;
LAB_001668e1:
      return (*paiVar11)[uStack_20];
    case 8:
      uVar9 = (bVar3 & 0xf) << 4 | (uint)(bVar3 >> 4);
      paiVar7 = (int (*) [5])0x28d728;
      break;
    case 9:
      paiVar7 = wall_matrix;
      break;
    case 10:
      uVar9 = (bVar3 & 3) << 6 | (uint)(bVar3 >> 2);
      paiVar7 = (int (*) [5])0x28d714;
      break;
    case 0xb:
      uVar9 = (uint)(bVar3 >> 6) + (uVar4 & 0x3f) * 4;
      paiVar7 = (int (*) [5])0x28d73c;
      break;
    default:
      goto switchD_001661c0_caseD_c;
    case 0xf:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6;
      if ((uVar9 >> 9 & 1) != 0) goto LAB_00166403;
LAB_001663da:
      uVar9 = uVar9 >> 4 & 7;
      if (uVar9 == 0) {
        return 2;
      }
      if (uVar9 == 2) {
        uVar5 = uVar4 & 0xffffffe3;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "wall_angle: unknown vwall mode %d";
LAB_00166691:
          impossible(pcVar10);
          return 1;
        }
        uVar5 = uVar5 & 0x3e;
      }
      bVar12 = uVar5 == 0;
      iVar6 = 2;
      goto LAB_00166657;
    }
    switch(*(uint *)&lev->locations[iVar8][iVar6].field_0x6 >> 4 & 7) {
    case 0:
      if (uVar9 == 0x10) {
LAB_00166620:
        uStack_20 = 1;
      }
      else {
        if (uVar9 == 0x40) goto LAB_00166624;
        if ((uVar9 & 0x50) == 0x50 || (uVar9 & 0xa8) != 0) {
          uStack_20 = 4;
        }
        else {
          if ((uVar9 & 7) == 0) {
LAB_00166843:
            t_warn(lev->locations[iVar8] + iVar6);
            goto LAB_00166848;
          }
          uStack_20 = 4 - (ulong)((uVar9 & 0x50) == 0);
        }
      }
      break;
    case 1:
      if ((uVar9 & 0x18) != 0 && (uVar9 & 0xe0) == 0) goto LAB_00166620;
      if ((uVar9 & 0xc0) != 0 && (uVar9 & 0x38) == 0) goto LAB_00166624;
      uStack_20 = 4;
      if (((uVar9 & 0x20) == 0) && ((uVar9 & 0x18) == 0 || (uVar9 & 0xc0) == 0)) {
        if ((uVar9 & 7) == 0 || (uVar9 & 0xd8) != 0) goto LAB_00166843;
LAB_00166848:
        uStack_20 = 0;
      }
      break;
    case 2:
      if ((uVar9 & 0x30) != 0 && (uVar9 & 0xcf) == 0) goto LAB_00166620;
      if ((uVar9 & 0x87) == 0 || (uVar9 & 0x38) != 0) {
        bVar12 = uVar9 == 0x40;
        goto LAB_00166766;
      }
LAB_001665cb:
      uStack_20 = 3;
      break;
    case 3:
      if ((uVar9 & 0x60) == 0 || (uVar9 & 0x9f) != 0) {
        if ((uVar9 & 0xf) != 0 && (uVar9 & 0xe0) == 0) goto LAB_001665cb;
        bVar12 = uVar9 == 0x10;
LAB_00166766:
        uStack_20 = (ulong)!bVar12 << 2;
      }
      else {
LAB_00166624:
        uStack_20 = 2;
      }
      break;
    default:
      uStack_20 = 0;
      impossible("wall_angle: unknown T wall mode %d");
    }
    iVar6 = (*paiVar7)[uStack_20];
    break;
  case 0xc:
    bVar12 = (lev->locations[iVar8][iVar6].field_0x7 & 2) == 0;
    iVar6 = 0x2f;
    goto LAB_00166657;
  case 0xd:
    iVar6 = 0x1e;
    break;
  case 0xe:
    iVar6 = 0x1f;
    break;
  case 0x11:
  case 0x12:
LAB_00166874:
    return 0x11;
  case 0x13:
    iVar6 = 0x14;
    break;
  case 0x14:
    uVar4 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6;
    uVar9 = uVar4 >> 4 & 0x1c;
    switch(uVar9 >> 2) {
    case 0:
      goto LAB_00166874;
    case 1:
      goto switchD_00166194_caseD_15;
    case 2:
      goto switchD_00166194_caseD_22;
    case 3:
      return ((uVar4 >> 0xb & 1) == 0 && (viz_array[iVar6][iVar8] & 2U) == 0) + 0xf;
    case 4:
      goto switchD_00166194_caseD_23;
    default:
      pcVar10 = "Strange db-under: %d";
      goto LAB_001662ee;
    }
  case 0x15:
switchD_00166194_caseD_15:
    iVar6 = 0x17;
    break;
  case 0x16:
    iVar6 = 0x1d;
    break;
  case 0x17:
    uVar9 = *(uint *)&lev->locations[iVar8][iVar6].field_0x6;
    if ((char)((uVar9 & 0x10) >> 4) == '\0' && (uVar9 & 0x1f0) != 0) {
      if ((uVar9 & 0x20) == 0) {
        iVar6 = ((uVar9 >> 9 & 1) != 0) + 0x1b;
      }
      else {
        iVar6 = ((uVar9 >> 9 & 1) != 0) + 0x19;
      }
    }
    else {
      iVar6 = 0x18;
    }
    break;
  case 0x18:
    iVar6 = ((lev->locations[iVar8][iVar6].field_0x7 & 8) != 0 || flags.lit_corridor != '\0') + 0xd;
    break;
  case 0x19:
    if ((viz_array[iVar6][iVar8] & 2U) != 0) {
      return 0xf;
    }
    return ((lev->locations[iVar8][iVar6].field_0x7 & 8) == 0) + 0xf;
  case 0x1a:
    if (((lev->sstairs).sx == x) && ((lev->sstairs).sy == y)) {
      bVar12 = (lev->locations[iVar8][iVar6].field_0x6 & 0x20) == 0;
      iVar6 = 0x25;
    }
    else {
      bVar12 = (lev->locations[iVar8][iVar6].field_0x6 & 0x20) == 0;
      iVar6 = 0x21;
    }
    goto LAB_00166657;
  case 0x1b:
    bVar12 = (lev->locations[iVar8][iVar6].field_0x6 & 0x20) == 0;
    iVar6 = 0x23;
    goto LAB_00166657;
  case 0x1c:
    iVar6 = 0x2b;
    break;
  case 0x1d:
    iVar6 = 0x28;
    break;
  case 0x1e:
    iVar6 = 0x29;
    break;
  case 0x1f:
    iVar6 = 0x2a;
    break;
  case 0x20:
    iVar6 = 0x27;
    break;
  case 0x21:
    iVar6 = 0x26;
    break;
  case 0x22:
switchD_00166194_caseD_22:
    iVar6 = 0x15;
    break;
  case 0x23:
switchD_00166194_caseD_23:
    iVar6 = 0x16;
    break;
  case 0x24:
    bVar12 = (lev->locations[iVar8][iVar6].field_0x7 & 2) == 0;
    iVar6 = 0x2d;
LAB_00166657:
    iVar6 = iVar6 - (uint)bVar12;
    break;
  case 0x25:
    iVar6 = 0x12;
    break;
  case 0x26:
    iVar6 = 0x13;
  }
  return iVar6;
}

Assistant:

int back_to_cmap(struct level *lev, xchar x, xchar y)
{
    int idx;
    struct rm *ptr = &(lev->locations[x][y]);

    switch (ptr->typ) {
	case SCORR:
	case STONE:
	    idx = lev->flags.arboreal ? S_tree : S_stone;
	    break;
	case ROOM:
	    idx = (!cansee(x,y) && !ptr->waslit) ? S_darkroom : S_room;
	    break;
	case CORR:
	    idx = (ptr->waslit || flags.lit_corridor) ? S_litcorr : S_corr;
	    break;
	case HWALL:
	case VWALL:
	case TLCORNER:
	case TRCORNER:
	case BLCORNER:
	case BRCORNER:
	case CROSSWALL:
	case TUWALL:
	case TDWALL:
	case TLWALL:
	case TRWALL:
	case SDOOR:
	    idx = ptr->seenv ? wall_angle(ptr) : S_stone;
	    break;
	case DOOR:
	    if (ptr->doormask) {
		if (ptr->doormask & D_BROKEN)
		    idx = S_ndoor;
		else if (ptr->doormask & D_ISOPEN)
		    idx = (ptr->horizontal) ? S_hodoor : S_vodoor;
		else			/* else is closed */
		    idx = (ptr->horizontal) ? S_hcdoor : S_vcdoor;
	    } else
		idx = S_ndoor;
	    break;
	case IRONBARS:		idx = S_bars;     break;
	case TREE:		idx = S_tree;     break;
	case DEADTREE:		idx = S_deadtree; break;
	case POOL:
	case MOAT:		idx = S_pool;	  break;
	case STAIRS:
            if (lev->sstairs.sx == x && lev->sstairs.sy == y)
                idx = (ptr->ladder & LA_DOWN) ? S_dnsstair : S_upsstair;
            else
                idx = (ptr->ladder & LA_DOWN) ? S_dnstair : S_upstair;
	    break;
	case LADDER:
	    idx = (ptr->ladder & LA_DOWN) ? S_dnladder : S_upladder;
	    break;
	case FOUNTAIN:		idx = S_fountain; break;
	case SINK:		idx = S_sink;     break;
	case ALTAR:		idx = S_altar;    break;
	case GRAVE:		idx = S_grave;    break;
	case THRONE:		idx = S_throne;   break;
	case MAGIC_CHEST:	idx = S_magic_chest; break;
	case LAVAPOOL:		idx = S_lava;	  break;
	case ICE:		idx = S_ice;      break;
	case AIR:		idx = S_air;	  break;
	case CLOUD:		idx = S_cloud;	  break;
	case WATER:		idx = S_water;	  break;
	case BOG:		idx = S_bog;	  break;
	case DBWALL:
	    idx = (ptr->horizontal) ? S_hcdbridge : S_vcdbridge;
	    break;
	case DRAWBRIDGE_UP:
	    switch(ptr->drawbridgemask & DB_UNDER) {
	    case DB_MOAT:  idx = S_pool; break;
	    case DB_LAVA:  idx = S_lava; break;
	    case DB_ICE:   idx = S_ice;  break;
	    case DB_FLOOR: idx = (!cansee(x,y) && !ptr->waslit) ? S_darkroom : S_room; break;
	    case DB_BOG:   idx = S_bog;  break;
	    default:
		impossible("Strange db-under: %d",
			   ptr->drawbridgemask & DB_UNDER);
		idx = S_room; /* something is better than nothing */
		break;
	    }
	    break;
	case DRAWBRIDGE_DOWN:
	    idx = (ptr->horizontal) ? S_hodbridge : S_vodbridge;
	    break;
	default:
	    impossible("back_to_cmap:  unknown location type [ = %d ]", ptr->typ);
	    idx = S_room;
	    break;
    }

    return idx;
}